

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

int duckdb_zstd::ZSTD_isRLE(BYTE *src,size_t length)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  BYTE *ip;
  BYTE *pBVar5;
  BYTE *pStart;
  ulong *puVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (length != 1) {
    uVar4 = (ulong)((uint)length & 0x1f);
    if ((length & 0x1f) != 0) {
      puVar1 = (ulong *)(src + 1);
      puVar6 = puVar1;
      puVar7 = (ulong *)src;
      if (uVar4 < 9) {
LAB_0127593a:
        puVar2 = (ulong *)(src + uVar4);
        if ((puVar6 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar7 == (int)*puVar6)) {
          puVar6 = (ulong *)((long)puVar6 + 4);
          puVar7 = (ulong *)((long)puVar7 + 4);
        }
        if ((puVar6 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar7 == (short)*puVar6)) {
          puVar6 = (ulong *)((long)puVar6 + 2);
          puVar7 = (ulong *)((long)puVar7 + 2);
        }
        if (puVar6 < puVar2) {
          puVar6 = (ulong *)((long)puVar6 + (ulong)((char)*puVar7 == (char)*puVar6));
        }
        uVar10 = (long)puVar6 - (long)puVar1;
      }
      else {
        uVar8 = *(ulong *)(src + 1) ^ *(ulong *)src;
        uVar10 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar10 = uVar10 >> 3 & 0x1fffffff;
        if (*(ulong *)src == *(ulong *)(src + 1)) {
          puVar6 = (ulong *)(src + 9);
          puVar7 = (ulong *)(src + 8);
          do {
            if (src + (uVar4 - 7) <= puVar6) goto LAB_0127593a;
            uVar8 = *puVar7;
            uVar3 = *puVar6;
            uVar9 = uVar3 ^ uVar8;
            uVar10 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            uVar10 = (long)puVar6 + ((uVar10 >> 3 & 0x1fffffff) - (long)puVar1);
            puVar6 = puVar6 + 1;
            puVar7 = puVar7 + 1;
          } while (uVar8 == uVar3);
        }
      }
      if (uVar10 != uVar4 - 1) {
        return 0;
      }
    }
    if (0x1f < length) {
      pBVar5 = src + uVar4;
      do {
        uVar10 = 0xfffffffffffffff8;
        do {
          if (*(long *)(pBVar5 + uVar10 + 8) != (ulong)*src * 0x101010101010101) {
            return 0;
          }
          uVar10 = uVar10 + 8;
        } while (uVar10 < 0x18);
        uVar4 = uVar4 + 0x20;
        pBVar5 = pBVar5 + 0x20;
      } while (uVar4 != length);
    }
  }
  return 1;
}

Assistant:

static int ZSTD_isRLE(const BYTE* src, size_t length) {
    const BYTE* ip = src;
    const BYTE value = ip[0];
    const size_t valueST = (size_t)((U64)value * 0x0101010101010101ULL);
    const size_t unrollSize = sizeof(size_t) * 4;
    const size_t unrollMask = unrollSize - 1;
    const size_t prefixLength = length & unrollMask;
    size_t i;
    if (length == 1) return 1;
    /* Check if prefix is RLE first before using unrolled loop */
    if (prefixLength && ZSTD_count(ip+1, ip, ip+prefixLength) != prefixLength-1) {
        return 0;
    }
    for (i = prefixLength; i != length; i += unrollSize) {
        size_t u;
        for (u = 0; u < unrollSize; u += sizeof(size_t)) {
            if (MEM_readST(ip + i + u) != valueST) {
                return 0;
    }   }   }
    return 1;
}